

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * uprv_decNumberDivide_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  uint32_t status;
  uint32_t local_1c;
  
  local_1c = 0;
  decDivideOp(res,lhs,rhs,set,0x80,&local_1c);
  if (local_1c != 0) {
    decStatus(res,local_1c,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberDivide(decNumber *res, const decNumber *lhs,
                            const decNumber *rhs, decContext *set) {
  uInt status=0;                        /* accumulator  */
  decDivideOp(res, lhs, rhs, set, DIVIDE, &status);
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }